

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__vertical_gather_with_3_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float *pfVar52;
  float *pfVar53;
  long lVar54;
  float *output;
  float *pfVar55;
  long lVar56;
  float fVar57;
  float fVar58;
  
  pfVar52 = *inputs;
  pfVar55 = inputs[1];
  fVar6 = *vertical_coefficients;
  pfVar53 = inputs[2];
  fVar57 = (float)*(undefined8 *)(vertical_coefficients + 1);
  fVar58 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 1) >> 0x20);
  if (0x3f < (long)input0_end - (long)pfVar52) {
    lVar56 = 0x100;
    lVar54 = 0;
    do {
      pfVar2 = (float *)((long)pfVar52 + lVar56 + -0x100);
      fVar7 = pfVar2[1];
      fVar8 = pfVar2[2];
      fVar9 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar52 + lVar56 + -0xf0);
      fVar10 = *pfVar3;
      fVar11 = pfVar3[1];
      fVar12 = pfVar3[2];
      fVar13 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar52 + lVar56 + -0xe0);
      fVar14 = *pfVar3;
      fVar15 = pfVar3[1];
      fVar16 = pfVar3[2];
      fVar17 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar52 + lVar56 + -0xd0);
      fVar18 = *pfVar3;
      fVar19 = pfVar3[1];
      fVar20 = pfVar3[2];
      fVar21 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar55 + lVar56 + -0x100);
      fVar22 = pfVar3[1];
      fVar23 = pfVar3[2];
      fVar24 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar55 + lVar56 + -0xf0);
      fVar25 = *pfVar4;
      fVar26 = pfVar4[1];
      fVar27 = pfVar4[2];
      fVar28 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar55 + lVar56 + -0xe0);
      fVar29 = *pfVar4;
      fVar30 = pfVar4[1];
      fVar31 = pfVar4[2];
      fVar32 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar55 + lVar56 + -0xd0);
      fVar33 = *pfVar4;
      fVar34 = pfVar4[1];
      fVar35 = pfVar4[2];
      fVar36 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar53 + lVar56 + -0x100);
      fVar37 = pfVar4[1];
      fVar38 = pfVar4[2];
      fVar39 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar53 + lVar56 + -0xf0);
      fVar40 = *pfVar5;
      fVar41 = pfVar5[1];
      fVar42 = pfVar5[2];
      fVar43 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar53 + lVar56 + -0xe0);
      fVar44 = *pfVar5;
      fVar45 = pfVar5[1];
      fVar46 = pfVar5[2];
      fVar47 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar53 + lVar56 + -0xd0);
      fVar48 = *pfVar5;
      fVar49 = pfVar5[1];
      fVar50 = pfVar5[2];
      fVar51 = pfVar5[3];
      *outputp = *pfVar4 * fVar58 + *pfVar3 * fVar57 + *pfVar2 * fVar6 + *outputp;
      outputp[1] = fVar37 * fVar58 + fVar22 * fVar57 + fVar7 * fVar6 + outputp[1];
      outputp[2] = fVar38 * fVar58 + fVar23 * fVar57 + fVar8 * fVar6 + outputp[2];
      outputp[3] = fVar39 * fVar58 + fVar24 * fVar57 + fVar9 * fVar6 + outputp[3];
      outputp[4] = fVar40 * fVar58 + fVar25 * fVar57 + fVar10 * fVar6 + outputp[4];
      outputp[5] = fVar41 * fVar58 + fVar26 * fVar57 + fVar11 * fVar6 + outputp[5];
      outputp[6] = fVar42 * fVar58 + fVar27 * fVar57 + fVar12 * fVar6 + outputp[6];
      outputp[7] = fVar43 * fVar58 + fVar28 * fVar57 + fVar13 * fVar6 + outputp[7];
      outputp[8] = fVar44 * fVar58 + fVar29 * fVar57 + fVar14 * fVar6 + outputp[8];
      outputp[9] = fVar45 * fVar58 + fVar30 * fVar57 + fVar15 * fVar6 + outputp[9];
      outputp[10] = fVar46 * fVar58 + fVar31 * fVar57 + fVar16 * fVar6 + outputp[10];
      outputp[0xb] = fVar47 * fVar58 + fVar32 * fVar57 + fVar17 * fVar6 + outputp[0xb];
      outputp[0xc] = fVar48 * fVar58 + fVar33 * fVar57 + fVar18 * fVar6 + outputp[0xc];
      outputp[0xd] = fVar49 * fVar58 + fVar34 * fVar57 + fVar19 * fVar6 + outputp[0xd];
      outputp[0xe] = fVar50 * fVar58 + fVar35 * fVar57 + fVar20 * fVar6 + outputp[0xe];
      outputp[0xf] = fVar51 * fVar58 + fVar36 * fVar57 + fVar21 * fVar6 + outputp[0xf];
      outputp = outputp + 0x10;
      lVar56 = lVar56 + 0x40;
      lVar1 = ((long)input0_end - (long)pfVar52) + lVar54;
      lVar54 = lVar54 + -0x40;
    } while (0x3f < lVar1 + -0x40);
    pfVar52 = (float *)((long)pfVar52 - lVar54);
    pfVar55 = (float *)((long)pfVar55 - lVar54);
    pfVar53 = (float *)((long)pfVar53 - lVar54);
  }
  for (lVar54 = (long)input0_end - (long)pfVar52; 0xf < lVar54; lVar54 = lVar54 + -0x10) {
    fVar7 = pfVar52[1];
    fVar8 = pfVar52[2];
    fVar9 = pfVar52[3];
    fVar10 = pfVar55[1];
    fVar11 = pfVar55[2];
    fVar12 = pfVar55[3];
    fVar13 = pfVar53[1];
    fVar14 = pfVar53[2];
    fVar15 = pfVar53[3];
    *outputp = *pfVar53 * fVar58 + *pfVar55 * fVar57 + *pfVar52 * fVar6 + *outputp;
    outputp[1] = fVar13 * fVar58 + fVar10 * fVar57 + fVar7 * fVar6 + outputp[1];
    outputp[2] = fVar14 * fVar58 + fVar11 * fVar57 + fVar8 * fVar6 + outputp[2];
    outputp[3] = fVar15 * fVar58 + fVar12 * fVar57 + fVar9 * fVar6 + outputp[3];
    outputp = outputp + 4;
    pfVar52 = pfVar52 + 4;
    pfVar55 = pfVar55 + 4;
    pfVar53 = pfVar53 + 4;
  }
  if (pfVar52 < input0_end) {
    lVar54 = 0;
    do {
      pfVar2 = (float *)((long)pfVar52 + lVar54);
      *(float *)((long)outputp + lVar54) =
           *(float *)((long)pfVar53 + lVar54) * fVar58 +
           *pfVar2 * fVar6 + *(float *)((long)outputp + lVar54) +
           *(float *)((long)pfVar55 + lVar54) * fVar57;
      lVar54 = lVar54 + 4;
    } while (pfVar2 + 1 < input0_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}